

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_split.hpp
# Opt level: O2

void __thiscall
RandomWordTestData<signed_char,_std::vector<signed_char,_std::allocator<signed_char>_>_>::
~RandomWordTestData(RandomWordTestData<signed_char,_std::vector<signed_char,_std::allocator<signed_char>_>_>
                    *this)

{
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->m_token_indexes).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::
  vector<std::vector<signed_char,_std::allocator<signed_char>_>,_std::allocator<std::vector<signed_char,_std::allocator<signed_char>_>_>_>
  ::~vector(&this->m_tokens);
  std::_Vector_base<signed_char,_std::allocator<signed_char>_>::~_Vector_base
            (&(this->m_str).super__Vector_base<signed_char,_std::allocator<signed_char>_>);
  std::_Vector_base<signed_char,_std::allocator<signed_char>_>::~_Vector_base
            ((_Vector_base<signed_char,_std::allocator<signed_char>_> *)this);
  return;
}

Assistant:

RandomWordTestData(T in_delim = default_delim<T>, size_t in_fixed_word_count = 0, size_t in_fixed_word_length = 0)
		: m_fixed_word_count{ in_fixed_word_count },
		m_fixed_word_length{ in_fixed_word_length } {
		m_delim.insert(m_delim.end(), in_delim);
		populate();
	}